

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Token.cpp
# Opt level: O0

Token __thiscall slang::parsing::Token::deepClone(Token *this,BumpAllocator *alloc)

{
  Token TVar1;
  bool bVar2;
  int iVar3;
  size_type sVar4;
  pointer pTVar5;
  reference this_00;
  undefined2 extraout_var_00;
  SourceLocation SVar6;
  undefined4 extraout_var;
  EVP_PKEY_CTX *src;
  undefined8 extraout_RDX;
  Info *extraout_RDX_00;
  EVP_PKEY_CTX *in_RSI;
  Token *in_RDI;
  void *in_R8;
  span<const_slang::parsing::Trivia,_18446744073709551615UL> sVar7;
  string_view sVar8;
  Trivia *t;
  iterator __end2;
  iterator __begin2;
  span<const_slang::parsing::Trivia,_18446744073709551615UL> *__range2;
  SmallVector<slang::parsing::Trivia,_2UL> triviaBuffer;
  Trivia *in_stack_fffffffffffffe88;
  SmallVectorBase<slang::parsing::Trivia> *in_stack_fffffffffffffe90;
  span<slang::parsing::Trivia,_18446744073709551615UL> *in_stack_fffffffffffffe98;
  Token *in_stack_fffffffffffffea0;
  Token *in_stack_fffffffffffffeb0;
  void *local_e0;
  int local_d8;
  undefined6 local_c8;
  __normal_iterator<const_slang::parsing::Trivia_*,_std::span<const_slang::parsing::Trivia,_18446744073709551615UL>_>
  local_a0 [3];
  pointer local_88;
  size_t local_80;
  pointer *local_78;
  span<const_slang::parsing::Trivia,_18446744073709551615UL> local_68;
  SmallVector<slang::parsing::Trivia,_2UL> local_58;
  EVP_PKEY_CTX *local_20;
  undefined8 local_10;
  Info *local_8;
  
  if (in_RDI->info == (Info *)0x0) {
    local_10._0_2_ = in_RDI->kind;
    local_10._2_1_ = in_RDI->field_0x2;
    local_10._3_1_ = in_RDI->numFlags;
    local_10._4_4_ = in_RDI->rawLen;
    local_8 = in_RDI->info;
  }
  else {
    local_20 = in_RSI;
    local_68 = trivia(in_stack_fffffffffffffeb0);
    sVar4 = std::span<const_slang::parsing::Trivia,_18446744073709551615UL>::size
                      ((span<const_slang::parsing::Trivia,_18446744073709551615UL> *)0x547c63);
    SmallVector<slang::parsing::Trivia,_2UL>::SmallVector(&local_58,sVar4);
    sVar7 = trivia(in_stack_fffffffffffffeb0);
    local_80 = (size_t)sVar7._M_extent._M_extent_value;
    pTVar5 = sVar7._M_ptr;
    local_78 = &local_88;
    local_88 = pTVar5;
    local_a0[0]._M_current =
         (Trivia *)
         std::span<const_slang::parsing::Trivia,_18446744073709551615UL>::begin
                   (in_stack_fffffffffffffe88);
    std::span<const_slang::parsing::Trivia,_18446744073709551615UL>::end
              ((span<const_slang::parsing::Trivia,_18446744073709551615UL> *)
               in_stack_fffffffffffffe98);
    while( true ) {
      iVar3 = (int)pTVar5;
      bVar2 = __gnu_cxx::
              operator==<const_slang::parsing::Trivia_*,_std::span<const_slang::parsing::Trivia,_18446744073709551615UL>_>
                        ((__normal_iterator<const_slang::parsing::Trivia_*,_std::span<const_slang::parsing::Trivia,_18446744073709551615UL>_>
                          *)in_stack_fffffffffffffe90,
                         (__normal_iterator<const_slang::parsing::Trivia_*,_std::span<const_slang::parsing::Trivia,_18446744073709551615UL>_>
                          *)in_stack_fffffffffffffe88);
      if (((bVar2 ^ 0xffU) & 1) == 0) break;
      this_00 = __gnu_cxx::
                __normal_iterator<const_slang::parsing::Trivia_*,_std::span<const_slang::parsing::Trivia,_18446744073709551615UL>_>
                ::operator*(local_a0);
      Trivia::clone(this_00,(__fn *)local_20,(void *)0x1,iVar3,in_R8);
      local_c8 = (undefined6)extraout_RDX;
      pTVar5 = (pointer)CONCAT62(local_c8,extraout_var_00);
      SmallVectorBase<slang::parsing::Trivia>::push_back
                (in_stack_fffffffffffffe90,in_stack_fffffffffffffe88);
      __gnu_cxx::
      __normal_iterator<const_slang::parsing::Trivia_*,_std::span<const_slang::parsing::Trivia,_18446744073709551615UL>_>
      ::operator++(local_a0);
    }
    SmallVectorBase<slang::parsing::Trivia>::copy
              (&local_58.super_SmallVectorBase<slang::parsing::Trivia>,local_20,src);
    std::span<const_slang::parsing::Trivia,_18446744073709551615UL>::
    span<slang::parsing::Trivia,_18446744073709551615UL>
              ((span<const_slang::parsing::Trivia,_18446744073709551615UL> *)
               in_stack_fffffffffffffea0,in_stack_fffffffffffffe98);
    sVar8 = rawText(in_stack_fffffffffffffea0);
    SVar6 = location(in_RDI);
    iVar3 = clone(in_RDI,(__fn *)local_20,local_e0,local_d8,(void *)sVar8._M_len,sVar8._M_str,SVar6)
    ;
    local_10 = CONCAT44(extraout_var,iVar3);
    local_8 = extraout_RDX_00;
    SmallVector<slang::parsing::Trivia,_2UL>::~SmallVector
              ((SmallVector<slang::parsing::Trivia,_2UL> *)0x547ebe);
  }
  TVar1.info = local_8;
  TVar1.kind = (undefined2)local_10;
  TVar1._2_1_ = local_10._2_1_;
  TVar1.numFlags.raw = local_10._3_1_;
  TVar1.rawLen = local_10._4_4_;
  return TVar1;
}

Assistant:

Token Token::deepClone(BumpAllocator& alloc) const {
    if (!info) {
        // No extra information, don't alloc extra info
        // If allocated it, the valid() function would fail
        return *this;
    }

    SmallVector<Trivia> triviaBuffer(trivia().size(), UninitializedTag());
    for (const auto& t : trivia())
        triviaBuffer.push_back(t.clone(alloc, true));
    return clone(alloc, triviaBuffer.copy(alloc), rawText(), location());
}